

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_construction_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  size_t seconds;
  DateTimeData dtd1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> factoryReset;
  vector<unsigned_char,_std::allocator<unsigned_char>_> r2Enc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dtd1Enc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> algClearTare;
  vector<unsigned_char,_std::allocator<unsigned_char>_> r1Enc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> r1Test;
  undefined1 auStack_78 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> r2Test;
  RegisterData local_58;
  RegisterData r1;
  RegisterData r2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dtd1Test;
  undefined1 auStack_28 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> packet;
  
  packet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_28 = (undefined1  [8])0x0;
  packet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  __l._M_len = 5;
  __l._M_array = &stack0xfffffffffffffec0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dtd1._seconds,__l,
             (allocator_type *)
             &dtd1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  uVar2 = 1;
  ximu::PacketConstruction::
  constructCommandPacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (FACTORY_RESET,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28);
  bVar1 = std::operator!=((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dtd1._seconds);
  if (!bVar1) {
    if ((undefined1  [8])
        packet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != auStack_28) {
      packet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)auStack_28;
    }
    __l_00._M_len = 5;
    __l_00._M_array = &stack0xfffffffffffffec0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &dtd1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,__l_00,
               (allocator_type *)
               &algClearTare.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    ximu::PacketConstruction::
    constructCommandPacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (ALGORITHM_CLEAR_TARE,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28);
    bVar1 = std::operator!=((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &dtd1Enc.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) {
      ximu::RegisterData::RegisterData(&local_58,ADXL_345C_SENSITIVITY_X,11.0);
      __l_01._M_len = 7;
      __l_01._M_array = &stack0xfffffffffffffec0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &algClearTare.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,__l_01,
                 (allocator_type *)
                 &r1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      r1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ximu::PacketConstruction::
      constructWriteRegisterPacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (&local_58,
                 (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
                 &r1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      bVar1 = std::operator!=((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &r1Enc.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &algClearTare.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) {
        ximu::RegisterData::RegisterData(&r1,BATTERY_SHUTDOWN_VOLTAGE);
        __l_02._M_len = 5;
        __l_02._M_array = &stack0xfffffffffffffec0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &factoryReset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,__l_02,
                   (allocator_type *)auStack_78);
        auStack_78 = (undefined1  [8])0x0;
        r2Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        r2Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        ximu::PacketConstruction::
        constructReadRegisterPacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (&r1,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_78);
        bVar1 = std::operator!=((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_78,
                                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                &factoryReset.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (!bVar1) {
          seconds = 0x304a403820024502;
          dtd1._year._0_2_ = 0xc04b;
          __l_03._M_len = 10;
          __l_03._M_array = &stack0xfffffffffffffec0;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &r2Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,__l_03,(allocator_type *)&r2
                    );
          r2._address = FIRMWARE_VERSION_MAJOR_NUM;
          r2._value = 0;
          r2._6_2_ = 0;
          ximu::DateTimeData::DateTimeData
                    ((DateTimeData *)&stack0xfffffffffffffec0,0x7de,0xc,7,10,0x19,seconds);
          ximu::PacketConstruction::
          constructWriteDateTimePacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((DateTimeData *)&stack0xfffffffffffffec0,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&r2);
          bVar1 = std::operator!=((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  &r2Enc.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&r2);
          uVar2 = (uint)bVar1;
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&r2);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &r2Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_78);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &factoryReset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &r1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &algClearTare.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               &dtd1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dtd1._seconds);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28);
  return uVar2;
}

Assistant:

int main(int argc, char* argv[]) {
  // the factory-reset command byte sequence has been extracted
  // from the c# gui application.
  // The test is to create the same byte sequence
  std::vector<unsigned char> packet;
  std::vector<unsigned char> factoryReset {0, 64, 0, 16, 144};

  ximu::PacketConstruction::constructCommandPacket(
      ximu::CommandCodes::FACTORY_RESET, back_inserter(packet));

  if (packet != factoryReset)
    return 1;

  // same test as the previous only now the command is the
  // algorithm clear tare command.
  packet.clear();
  std::vector<unsigned char> algClearTare {0, 64, 1, 113, 128};

  ximu::PacketConstruction::constructCommandPacket(
      ximu::CommandCodes::ALGORITHM_CLEAR_TARE, back_inserter(packet));

  if (packet != algClearTare)
    return 1;


  // Constucting RegisterData read/write 
  // write packet
  ximu::RegisterData r1(ximu::reg::RegisterAddresses::ADXL_345C_SENSITIVITY_X,11.0f);
  std::vector<unsigned char> r1Enc {1, 64, 12, 32,  22, 0, 206};	
  std::vector<unsigned char> r1Test;
  ximu::PacketConstruction::constructWriteRegisterPacket(r1,back_inserter(r1Test));

  if (r1Test != r1Enc)
    return 1;
  
  //read packet
  ximu::RegisterData r2(ximu::reg::RegisterAddresses::BATTERY_SHUTDOWN_VOLTAGE);
  std::vector<unsigned char> r2Enc {1, 0, 9, 4, 208};
  std::vector<unsigned char> r2Test;
  ximu::PacketConstruction::constructReadRegisterPacket(r2,back_inserter(r2Test));


  if (r2Test != r2Enc)
    return 1;

  // Constucting of the DateTimeData
  std::vector<unsigned char> dtd1Enc {2, 69, 2, 32, 56, 64, 74, 48, 75, 192};
  std::vector<unsigned char> dtd1Test;
  ximu::DateTimeData dtd1(2014, 12, 07, 10, 25, 30);
  ximu::PacketConstruction::constructWriteDateTimePacket(dtd1,back_inserter(dtd1Test));
  
  if (dtd1Enc != dtd1Test)
    return 1;
 
  
  
  return 0;
}